

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O0

HRESULT utf8::WideStringToNarrow<void*(*)(unsigned_long)>
                  (_func_void_ptr_unsigned_long *allocator,LPCWSTR sourceString,size_t sourceCount,
                  LPSTR *destStringPtr,size_t *destCount,size_t *allocateCount)

{
  ulong cbDest;
  utf8char_t *dest;
  size_t sVar1;
  PAL_FILE *pPVar2;
  size_t cbEncoded;
  utf8char_t *destString;
  size_t cbDestString;
  size_t cchSourceString;
  size_t *allocateCount_local;
  size_t *destCount_local;
  LPSTR *destStringPtr_local;
  size_t sourceCount_local;
  LPCWSTR sourceString_local;
  _func_void_ptr_unsigned_long *allocator_local;
  
  if (sourceCount < 0xffffffff) {
    cbDest = sourceCount * 3 + 1;
    if (cbDest < sourceCount) {
      allocator_local._4_4_ = -0x7ff8fff2;
    }
    else {
      dest = (utf8char_t *)(*allocator)(cbDest);
      if (dest == (utf8char_t *)0x0) {
        allocator_local._4_4_ = -0x7ff8fff2;
      }
      else {
        sVar1 = EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                          (dest,cbDest,sourceString,(charcount_t)sourceCount);
        if (cbDest < sVar1) {
          pPVar2 = PAL_get_stderr(0);
          PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                      ,0x33,"cbEncoded <= cbDestString");
          pPVar2 = PAL_get_stderr(0);
          PAL_fflush(pPVar2);
          DebugBreak();
        }
        *destStringPtr = (LPSTR)dest;
        *destCount = sVar1;
        if (allocateCount != (size_t *)0x0) {
          *allocateCount = sVar1;
        }
        allocator_local._4_4_ = 0;
      }
    }
  }
  else {
    allocator_local._4_4_ = -0x7ff8fff2;
  }
  return allocator_local._4_4_;
}

Assistant:

HRESULT WideStringToNarrow(
        _In_ AllocatorFunction allocator,
        _In_ LPCWSTR sourceString,
        size_t sourceCount,
        _Out_ LPSTR* destStringPtr,
        _Out_ size_t* destCount,
        size_t* allocateCount = nullptr)
    {
        size_t cchSourceString = sourceCount;

        if (cchSourceString >= MAXUINT32)
        {
            return E_OUTOFMEMORY;
        }

        // Multiply by 3 for max size of encoded character, plus 1 for the null terminator (don't need 3 bytes for the null terminator)
        size_t cbDestString = (cchSourceString * 3) + 1;

        // Check for overflow- cbDestString should be >= cchSourceString
        if (cbDestString < cchSourceString)
        {
            return E_OUTOFMEMORY;
        }

        utf8char_t* destString = (utf8char_t*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        size_t cbEncoded = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::TrueUtf8>(destString, cbDestString, sourceString, static_cast<charcount_t>(cchSourceString));
        Assert(cbEncoded <= cbDestString);
        static_assert(sizeof(utf8char_t) == sizeof(char), "Needs to be valid for cast");
        *destStringPtr = (char*)destString;
        *destCount = cbEncoded;
        if (allocateCount != nullptr)
        {
            *allocateCount = cbEncoded;
        }

        return S_OK;
    }